

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  bool local_31;
  bool ret;
  lock_guard<std::recursive_mutex> request_mutex_guard;
  Error *error_local;
  Response *res_local;
  Request *req_local;
  ClientImpl *this_local;
  
  request_mutex_guard._M_device = (mutex_type *)__n;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&stack0xffffffffffffffd0,&this->request_mutex_);
  local_31 = send_(this,(Request *)CONCAT44(in_register_00000034,__fd),(Response *)__buf,
                   (Error *)request_mutex_guard._M_device);
  if (((request_mutex_guard._M_device)->super___recursive_mutex_base)._M_mutex.__data.__lock == 0xe)
  {
    if (((local_31 ^ 0xffU) & 1) == 0) {
      __assert_fail("!ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                    ,0x18f4,"bool httplib::ClientImpl::send(Request &, Response &, Error &)");
    }
    local_31 = send_(this,(Request *)CONCAT44(in_register_00000034,__fd),(Response *)__buf,
                     (Error *)request_mutex_guard._M_device);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard
            ((lock_guard<std::recursive_mutex> *)&stack0xffffffffffffffd0);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),local_31);
}

Assistant:

inline bool ClientImpl::send(Request &req, Response &res, Error &error) {
  std::lock_guard<std::recursive_mutex> request_mutex_guard(request_mutex_);
  auto ret = send_(req, res, error);
  if (error == Error::SSLPeerCouldBeClosed_) {
    assert(!ret);
    ret = send_(req, res, error);
  }
  return ret;
}